

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution_v1_generated.h
# Opt level: O0

bool __thiscall Evolution::V1::TableA::Verify(TableA *this,Verifier *verifier)

{
  bool bVar1;
  undefined1 local_19;
  Verifier *verifier_local;
  TableA *this_local;
  
  bVar1 = flatbuffers::Table::VerifyTableStart(&this->super_Table,verifier);
  local_19 = false;
  if (bVar1) {
    bVar1 = flatbuffers::Table::VerifyField<float>(&this->super_Table,verifier,4,4);
    local_19 = false;
    if (bVar1) {
      bVar1 = flatbuffers::Table::VerifyField<int>(&this->super_Table,verifier,6,4);
      local_19 = false;
      if (bVar1) {
        local_19 = flatbuffers::VerifierTemplate<false>::EndTable(verifier);
      }
    }
  }
  return local_19;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<float>(verifier, VT_A, 4) &&
           VerifyField<int32_t>(verifier, VT_B, 4) &&
           verifier.EndTable();
  }